

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O0

Bytes * __thiscall
SSM::ECUPort::readECUPacket(Bytes *__return_storage_ptr__,ECUPort *this,bool echo)

{
  value_type vVar1;
  Byte BVar2;
  Byte BVar3;
  reference pvVar4;
  InvalidChecksum *this_00;
  allocator<char> local_121;
  string local_120;
  byte *local_100;
  byte *local_f8;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_f0;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_e8;
  const_iterator local_e0;
  Bytes local_d8;
  Byte local_bb [2];
  value_type local_b9;
  undefined1 local_b8 [5];
  Byte csum;
  uint8_t dsize;
  Bytes local_a0;
  Bytes local_88;
  Bytes local_70;
  byte local_56;
  byte local_55 [7];
  Byte DEST;
  Byte SRC;
  allocator<std::byte> local_41;
  undefined1 local_40 [8];
  Bytes header;
  bool echo_local;
  ECUPort *this_local;
  Bytes *body;
  
  header.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = echo;
  std::allocator<std::byte>::allocator(&local_41);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_40,4,&local_41);
  std::allocator<std::byte>::~allocator(&local_41);
  local_55[0] = 0x10;
  local_56 = 0xf0;
  if ((header.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    std::swap<std::byte>(local_55,&local_56);
  }
  do {
    do {
      do {
        readBytes(&local_70,this,1);
        pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[](&local_70,0);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                           ((vector<std::byte,_std::allocator<std::byte>_> *)local_40,0);
        *pvVar4 = vVar1;
        std::vector<std::byte,_std::allocator<std::byte>_>::~vector(&local_70);
        pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                           ((vector<std::byte,_std::allocator<std::byte>_> *)local_40,0);
      } while (*pvVar4 != 0x80);
      readBytes(&local_88,this,1);
      pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[](&local_88,0);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                         ((vector<std::byte,_std::allocator<std::byte>_> *)local_40,1);
      *pvVar4 = vVar1;
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector(&local_88);
      pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                         ((vector<std::byte,_std::allocator<std::byte>_> *)local_40,1);
    } while (*pvVar4 != local_56);
    readBytes(&local_a0,this,1);
    pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[](&local_a0,0);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                       ((vector<std::byte,_std::allocator<std::byte>_> *)local_40,2);
    *pvVar4 = vVar1;
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector(&local_a0);
    pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                       ((vector<std::byte,_std::allocator<std::byte>_> *)local_40,2);
  } while (*pvVar4 != local_55[0]);
  readBytes((Bytes *)local_b8,this,1);
  pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                     ((vector<std::byte,_std::allocator<std::byte>_> *)local_b8,0);
  vVar1 = *pvVar4;
  pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                     ((vector<std::byte,_std::allocator<std::byte>_> *)local_40,3);
  *pvVar4 = vVar1;
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_b8);
  pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::back
                     ((vector<std::byte,_std::allocator<std::byte>_> *)local_40);
  local_b9 = *pvVar4;
  local_bb[1] = 0;
  readBytes(__return_storage_ptr__,this,(uint)local_b9);
  readBytes(&local_d8,this,1);
  pvVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[](&local_d8,0);
  BVar2 = *pvVar4;
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector(&local_d8);
  local_bb[0] = BVar2;
  local_e8._M_current =
       (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::begin(__return_storage_ptr__);
  __gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>::
  __normal_iterator<std::byte*>
            ((__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>> *
             )&local_e0,&local_e8);
  local_f0._M_current =
       (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::begin
                         ((vector<std::byte,_std::allocator<std::byte>_> *)local_40);
  local_f8 = (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::end
                               ((vector<std::byte,_std::allocator<std::byte>_> *)local_40);
  local_100 = (byte *)std::vector<std::byte,std::allocator<std::byte>>::
                      insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
                                ((vector<std::byte,std::allocator<std::byte>> *)
                                 __return_storage_ptr__,local_e0,local_f0,
                                 (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                                  )local_f8);
  BVar2 = local_bb[0];
  BVar3 = checksum(this,__return_storage_ptr__);
  if (BVar2 != BVar3) {
    this_00 = (InvalidChecksum *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"Checksum validation failed",&local_121);
    InvalidChecksum::InvalidChecksum(this_00,&local_120);
    __cxa_throw(this_00,&InvalidChecksum::typeinfo,InvalidChecksum::~InvalidChecksum);
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::push_back(__return_storage_ptr__,local_bb);
  local_bb[1] = 1;
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Bytes ECUPort::readECUPacket(bool echo) const
  {
    // Skip until we receive next complete package
    // Expected header of packet: -header byte,
    //                            -destination byte
    //                            -source byte
    //                            -datasize byte
    Bytes header(4);
    Byte SRC(ECU),DEST(TOOL);
    if(echo) std::swap(SRC, DEST);
    while(true)
      {
	header[0] = readBytes(1)[0];
	if (header[0] != HEADER) continue;

	header[1] = readBytes(1)[0];
	if (header[1] != DEST) continue;

	header[2] = readBytes(1)[0];
	if (header[2] != SRC) continue;

	header[3] = readBytes(1)[0];
	break;
      }

    // Now that dsize is known read response body and checksum
    uint8_t dsize = std::to_integer<uint8_t>(header.back());
    Bytes body = readBytes(dsize); Byte csum = readBytes(1)[0];

    // Validate checksum
    body.insert(body.begin(), header.begin(), header.end());
    if(csum != checksum(body))
      throw(InvalidChecksum("Checksum validation failed"));

    // Add the checksum and return
    body.push_back(csum);
    return body;
  }